

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighterquietus.cpp
# Opt level: O3

int AF_A_FSwordFlames(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  uint uVar4;
  int iVar5;
  PClass *pPVar6;
  PClassActor *type;
  undefined8 *puVar7;
  int iVar8;
  char *__assertion;
  bool bVar9;
  DVector2 v;
  FName local_64;
  double local_60;
  double local_58;
  double local_50;
  DVector3 local_48;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005dd42f;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    puVar7 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar7 == (undefined8 *)0x0) {
LAB_005dd246:
        puVar7 = (undefined8 *)0x0;
      }
      else {
        pPVar6 = (PClass *)puVar7[1];
        if (pPVar6 == (PClass *)0x0) {
          pPVar6 = (PClass *)(**(code **)*puVar7)(puVar7);
          puVar7[1] = pPVar6;
        }
        bVar9 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar3 && bVar9) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar9 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar3) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar9) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005dd42f;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005dd306;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005dd41f;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar6 = (PClass *)puVar2[1];
            if (pPVar6 == (PClass *)0x0) {
              pPVar6 = (PClass *)(**(code **)*puVar2)(puVar2);
              puVar2[1] = pPVar6;
            }
            bVar9 = pPVar6 != (PClass *)0x0;
            if (pPVar6 != pPVar3 && bVar9) {
              do {
                pPVar6 = pPVar6->ParentClass;
                bVar9 = pPVar6 != (PClass *)0x0;
                if (pPVar6 == pPVar3) break;
              } while (pPVar6 != (PClass *)0x0);
            }
            if (!bVar9) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005dd42f;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005dd41f;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005dd306:
        uVar4 = FRandom::GenRand32(&pr_fswordflame);
        iVar8 = (uVar4 & 3) + 1;
        do {
          uVar4 = FRandom::GenRand32(&pr_fswordflame);
          local_50 = (double)(int)((uVar4 & 0xff) - 0x80) * 0.0625;
          uVar4 = FRandom::GenRand32(&pr_fswordflame);
          local_58 = (double)(int)((uVar4 & 0xff) - 0x80) * 0.0625;
          uVar4 = FRandom::GenRand32(&pr_fswordflame);
          local_60 = (double)(int)((uVar4 & 0xff) - 0x80) * 0.125;
          iVar5 = FName::NameManager::FindName(&FName::NameData,"FSwordFlame",false);
          P_GetOffsetPosition((double)puVar7[9],(double)puVar7[10],local_50,local_58);
          local_48.Z = local_60 + (double)puVar7[0xb];
          local_64.Index = iVar5;
          type = ClassForSpawn(&local_64);
          AActor::StaticSpawn(type,&local_48,ALLOW_REPLACE,false);
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005dd42f;
    }
    if (puVar7 == (undefined8 *)0x0) goto LAB_005dd246;
  }
LAB_005dd41f:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005dd42f:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                ,0x70,"int AF_A_FSwordFlames(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FSwordFlames)
{
	PARAM_ACTION_PROLOGUE;

	int i;

	for (i = 1+(pr_fswordflame()&3); i; i--)
	{
		double xo = (pr_fswordflame() - 128) / 16.;
		double yo = (pr_fswordflame() - 128) / 16.;
		double zo = (pr_fswordflame() - 128) / 8.;
		Spawn ("FSwordFlame", self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
	}
	return 0;
}